

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

CheckStreamRez * __thiscall
H264StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,H264StreamReader *this,uint8_t *buffer,int len)

{
  map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  *this_01;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  byte *buffer_00;
  uint8_t *end;
  SPSUnit *pSVar6;
  iterator iVar7;
  iterator iVar8;
  uint orig_hrd_parameters_present_flag;
  CodecInfo *pCVar9;
  ulong uVar10;
  uint8_t *end_00;
  string tmpDescr;
  string local_478;
  SliceUnit slice;
  uint8_t tmpBuffer [512];
  SEIUnit lastSEI;
  
  lastSEI.m_processedMessages._M_h._M_buckets = &lastSEI.m_processedMessages._M_h._M_single_bucket;
  lastSEI.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  lastSEI.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  lastSEI.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  lastSEI.super_NALUnit.bitReader.m_curVal = 0;
  lastSEI.super_NALUnit.bitReader.m_bitLeft = 0;
  lastSEI.super_NALUnit.nal_unit_type = nuUnspecified;
  lastSEI.super_NALUnit.nal_ref_idc = 0;
  lastSEI.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  lastSEI.super_NALUnit.m_nalBufferLen = 0;
  lastSEI.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0024a4f0;
  lastSEI.pic_struct = '\0';
  lastSEI.m_processedMessages._M_h._M_bucket_count = 1;
  lastSEI.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  lastSEI.m_processedMessages._M_h._M_element_count = 0;
  lastSEI.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&lastSEI.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  lastSEI.number_of_offset_sequences = -1;
  lastSEI.metadataPtsOffset = 0;
  lastSEI.m_mvcHeaderLen = 0;
  lastSEI.m_mvcHeaderStart = (uint8_t *)0x0;
  SliceUnit::SliceUnit(&slice);
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  end_00 = buffer + len;
  tmpDescr._M_dataplus._M_p = (pointer)&tmpDescr.field_2;
  tmpDescr._M_string_length = 0;
  tmpDescr.field_2._M_local_buf[0] = '\0';
  buffer_00 = NALUnit::findNextNAL(buffer,end_00);
  this_00 = &this->m_spsMap;
  p_Var1 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
  this_01 = &this->m_ppsMap;
  bVar4 = false;
  bVar3 = false;
  for (; buffer_00 < end_00 + -4; buffer_00 = NALUnit::findNextNAL(buffer_00,end_00)) {
    bVar2 = *buffer_00;
    if ((char)bVar2 < '\0') goto LAB_00198d55;
    end = NALUnit::findNALWithStartCode(buffer_00,end_00,true);
    if ((end == end_00) && ((this->super_MPEGStreamReader).m_eof == false)) break;
    switch(bVar2 & 0x1f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 0x14:
      if (((this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
         ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        uVar10 = (long)end - (long)buffer_00;
        if (0x1f7 < uVar10) {
          uVar10 = 0x1f8;
        }
        iVar5 = NALUnit::decodeNAL(buffer_00,buffer_00 + uVar10,tmpBuffer,0x200);
        iVar5 = SliceUnit::deserialize(&slice,tmpBuffer,tmpBuffer + iVar5,this_00,this_01);
        if (iVar5 != 0) goto LAB_00198d55;
        pCVar9 = &::h264CodecInfo;
        if (this->m_mvcSubStream != false) {
          pCVar9 = &::h264DepCodecInfo;
        }
        CodecInfo::operator=(&__return_storage_ptr__->codecInfo,pCVar9);
        std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->streamDescr);
      }
      break;
    case 6:
      if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pSVar6 = (SPSUnit *)
                 (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        NALUnit::decodeBuffer(&lastSEI.super_NALUnit,buffer_00,end);
        orig_hrd_parameters_present_flag = 1;
        if ((pSVar6->nalHrdParams).isPresent == false) {
          orig_hrd_parameters_present_flag = (uint)(pSVar6->vclHrdParams).isPresent;
        }
        SEIUnit::deserialize(&lastSEI,pSVar6,orig_hrd_parameters_present_flag);
        if (0xfb < (byte)(lastSEI.pic_struct - 9U) && !bVar3) {
          SPSUnit::getStreamDescr_abi_cxx11_((string *)tmpBuffer,pSVar6);
          std::__cxx11::string::operator=((string *)&tmpDescr,(string *)tmpBuffer);
          std::__cxx11::string::~string((string *)tmpBuffer);
          bVar3 = true;
          std::__cxx11::string::append((char *)&tmpDescr);
        }
        if (-1 < lastSEI.number_of_offset_sequences && !bVar4) {
          int32ToStr_abi_cxx11_(&local_478,&lastSEI.number_of_offset_sequences);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         tmpBuffer,"  3d-pg-planes: ",&local_478);
          std::__cxx11::string::append((string *)&tmpDescr);
          std::__cxx11::string::~string((string *)tmpBuffer);
          std::__cxx11::string::~string((string *)&local_478);
          bVar4 = true;
        }
      }
      break;
    case 7:
      this->m_mvcPrimaryStream = true;
      goto LAB_00198ba7;
    case 8:
      pSVar6 = (SPSUnit *)operator_new(0x58);
      PPSUnit::PPSUnit((PPSUnit *)pSVar6);
      NALUnit::decodeBuffer((NALUnit *)pSVar6,buffer_00,end);
      iVar5 = PPSUnit::deserialize((PPSUnit *)pSVar6);
      if (iVar5 != 0) {
        NALUnit::~NALUnit((NALUnit *)pSVar6);
        uVar10 = 0x58;
        goto LAB_00198d4d;
      }
      iVar7 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::find(&this_00->_M_t,(key_type_conflict1 *)&pSVar6->sar_height);
      if (((_Rb_tree_header *)iVar7._M_node != p_Var1) &&
         (iVar8 = std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_PPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_PPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
                  ::find(&this_01->_M_t,(key_type_conflict1 *)&pSVar6->m_ready),
         (_Rb_tree_header *)iVar8._M_node == &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header))
      {
        tmpBuffer._0_4_ = *(undefined4 *)&pSVar6->m_ready;
        tmpBuffer._8_8_ = pSVar6;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,PPSUnit*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
                    *)this_01,(pair<unsigned_int,_PPSUnit_*> *)tmpBuffer);
        break;
      }
      NALUnit::~NALUnit((NALUnit *)pSVar6);
      uVar10 = 0x58;
      goto LAB_00198c77;
    case 0xf:
      this->m_mvcSubStream = true;
LAB_00198ba7:
      pSVar6 = (SPSUnit *)operator_new(0x200);
      SPSUnit::SPSUnit(pSVar6);
      NALUnit::decodeBuffer((NALUnit *)pSVar6,buffer_00,end);
      iVar5 = SPSUnit::deserialize(pSVar6);
      if (iVar5 != 0) {
        SPSUnit::~SPSUnit(pSVar6);
        uVar10 = 0x200;
LAB_00198d4d:
        operator_delete(pSVar6,uVar10);
        goto LAB_00198d55;
      }
      iVar7 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::find(&this_00->_M_t,&pSVar6->seq_parameter_set_id);
      if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
        tmpBuffer._0_4_ = pSVar6->seq_parameter_set_id;
        tmpBuffer._8_8_ = pSVar6;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,SPSUnit*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
                    *)this_00,(pair<unsigned_int,_SPSUnit_*> *)tmpBuffer);
        if (tmpDescr._M_string_length == 0) {
          SPSUnit::getStreamDescr_abi_cxx11_((string *)tmpBuffer,pSVar6);
          std::__cxx11::string::operator=((string *)&tmpDescr,(string *)tmpBuffer);
          std::__cxx11::string::~string((string *)tmpBuffer);
        }
      }
      else {
        SPSUnit::~SPSUnit(pSVar6);
        uVar10 = 0x200;
LAB_00198c77:
        operator_delete(pSVar6,uVar10);
      }
    }
  }
  if ((this->m_mvcSubStream == true) && (this->m_mvcPrimaryStream == true)) {
    __return_storage_ptr__->multiSubStream = true;
  }
LAB_00198d55:
  std::__cxx11::string::~string((string *)&tmpDescr);
  NALUnit::~NALUnit(&slice.super_NALUnit);
  SEIUnit::~SEIUnit(&lastSEI);
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez H264StreamReader::checkStream(uint8_t *buffer, int len)
{
    SEIUnit lastSEI;
    SliceUnit slice;
    CheckStreamRez rez;
    uint8_t *end = buffer + len;
    std::string tmpDescr;
    bool pulldownInserted = false;
    bool offsetsInserted = false;

    for (uint8_t *nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;
        auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
        {
            if (nalType == NALUnit::NALType::nuSPS)
                m_mvcPrimaryStream = true;
            auto sps = new SPSUnit();
            sps->decodeBuffer(nal, nextNal);
            if (sps->deserialize() != 0)
            {
                delete sps;
                return rez;
            }
            if (m_spsMap.find(sps->seq_parameter_set_id) != m_spsMap.end())
            {
                delete sps;
                break;
            }
            m_spsMap.insert(make_pair(sps->seq_parameter_set_id, sps));
            if (tmpDescr.empty())
                tmpDescr = sps->getStreamDescr();
            break;
        }
        case NALUnit::NALType::nuPPS:
        {
            auto pps = new PPSUnit();
            pps->decodeBuffer(nal, nextNal);
            if (pps->deserialize() != 0)
            {
                delete pps;
                return rez;
            }
            if (m_spsMap.find(pps->seq_parameter_set_id) == m_spsMap.end() ||
                m_ppsMap.find(pps->pic_parameter_set_id) != m_ppsMap.end())
            {
                delete pps;
                break;
            }
            m_ppsMap.insert(make_pair(pps->pic_parameter_set_id, pps));
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (!m_spsMap.empty())
            {
                SPSUnit *sps = m_spsMap.begin()->second;
                lastSEI.decodeBuffer(nal, nextNal);
                lastSEI.deserialize(*sps, sps->nalHrdParams.isPresent || sps->vclHrdParams.isPresent);
                if (lastSEI.pic_struct == 5 || lastSEI.pic_struct == 6 || lastSEI.pic_struct == 7 ||
                    lastSEI.pic_struct == 8)
                {
                    if (!pulldownInserted)
                    {
                        pulldownInserted = true;
                        tmpDescr = sps->getStreamDescr();
                        tmpDescr += " (pulldown)";
                    }
                }
                if (!offsetsInserted && lastSEI.number_of_offset_sequences >= 0)
                {
                    offsetsInserted = true;
                    tmpDescr += "  3d-pg-planes: " + int32ToStr(lastSEI.number_of_offset_sequences);
                }
            }
            break;

        case NALUnit::NALType::nuSliceIDR:
            // m_openGOP = false;
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (m_ppsMap.empty() || m_spsMap.empty())
                break;
            try
            {
                uint8_t tmpBuffer[512];
                int toDecode = static_cast<int>(FFMIN(sizeof(tmpBuffer) - 8, nextNal - nal));
                int decodedLen = SliceUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                int nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
                if (nalRez != 0)
                    return rez;

                if (m_mvcSubStream)
                    rez.codecInfo = h264DepCodecInfo;
                else
                    rez.codecInfo = h264CodecInfo;
                rez.streamDescr = tmpDescr;
            }
            catch (BitStreamException &e)
            {
                (void)e;
                return rez;
            }
            break;
        default:
            break;
        }
    }
    if (m_mvcSubStream && m_mvcPrimaryStream)
        rez.multiSubStream = true;

    return rez;
}